

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall
cfd::core::Serializer::AddPrefixBuffer
          (Serializer *this,uint64_t prefix,uint8_t *buffer,uint32_t buffer_size)

{
  uint32_t uVar1;
  uint32_t size;
  uint32_t buffer_size_local;
  uint8_t *buffer_local;
  uint64_t prefix_local;
  Serializer *this_local;
  
  uVar1 = GetVariableIntSize(prefix);
  AddVariableInt(this,(ulong)(uVar1 + buffer_size));
  AddVariableInt(this,prefix);
  AddDirectBytes(this,buffer,buffer_size);
  return;
}

Assistant:

void Serializer::AddPrefixBuffer(
    uint64_t prefix, const uint8_t* buffer, uint32_t buffer_size) {
  uint32_t size = GetVariableIntSize(prefix) + buffer_size;
  AddVariableInt(size);
  AddVariableInt(prefix);
  AddDirectBytes(buffer, buffer_size);
}